

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O1

void __thiscall BackwardPass::DumpBlockData(BackwardPass *this,BasicBlock *block,Instr *instr)

{
  ulong uVar1;
  BVSparse<Memory::JitArenaAllocator> *this_00;
  bool bVar2;
  BVSparse<Memory::JitArenaAllocator> *obj;
  long lVar3;
  ulong uVar4;
  undefined8 auStack_d8 [2];
  BVSparse<Memory::JitArenaAllocator> *local_c8;
  BvToDump bvToDumps [6];
  
  if (instr == (Instr *)0x0) {
    obj = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  }
  else {
    auStack_d8[1] = 0x3eade9;
    obj = GetByteCodeRegisterUpwardExposed(this,block,instr->m_func,this->tempAlloc);
  }
  local_c8 = block->upwardExposedUses;
  bvToDumps[0].bv = (BVSparse<Memory::JitArenaAllocator> *)anon_var_dwarf_8695a3;
  if (block->upwardExposedUses == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    bvToDumps[0].tag = (char16 *)0x0;
  }
  else {
    auStack_d8[1] = 0x3eae1b;
    bvToDumps[0].tag = (char16 *)PAL_wcslen(L"Exposed Use");
  }
  bvToDumps[0].tagLen = (size_t)block->typesNeedingKnownObjectLayout;
  bvToDumps[1].bv = (BVSparse<Memory::JitArenaAllocator> *)anon_var_dwarf_8695af;
  if (block->typesNeedingKnownObjectLayout == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    bvToDumps[1].tag = (char16 *)0x0;
  }
  else {
    auStack_d8[1] = 0x3eae50;
    bvToDumps[1].tag = (char16 *)PAL_wcslen(L"Needs Known Object Layout");
  }
  bvToDumps[1].tagLen = (size_t)block->upwardExposedFields;
  bvToDumps[2].bv = (BVSparse<Memory::JitArenaAllocator> *)anon_var_dwarf_8695c7;
  if (block->upwardExposedFields == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    bvToDumps[2].tag = (char16 *)0x0;
  }
  else {
    auStack_d8[1] = 0x3eae85;
    bvToDumps[2].tag = (char16 *)PAL_wcslen(L"Exposed Fields");
  }
  bvToDumps[2].tagLen = (size_t)block->byteCodeUpwardExposedUsed;
  bvToDumps[3].bv = (BVSparse<Memory::JitArenaAllocator> *)anon_var_dwarf_8695df;
  if (block->byteCodeUpwardExposedUsed == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    bvToDumps[3].tag = (char16 *)0x0;
  }
  else {
    auStack_d8[1] = 0x3eaeb4;
    bvToDumps[3].tag = (char16 *)PAL_wcslen(L"Byte Code Use");
  }
  bvToDumps[3].tagLen = (size_t)obj;
  bvToDumps[4].bv = (BVSparse<Memory::JitArenaAllocator> *)anon_var_dwarf_8695f7;
  if (obj == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    bvToDumps[4].tag = (char16 *)0x0;
  }
  else {
    auStack_d8[1] = 0x3eaedc;
    bvToDumps[4].tag = (char16 *)PAL_wcslen(L"Byte Code Reg Use");
  }
  if ((this->isCollectionPass == false) && ((block->field_0x18 & 2) == 0)) {
    auStack_d8[1] = 0x3eaefc;
    bVar2 = DoDeadStoreSlots(this);
    if (bVar2) {
      bvToDumps[4].tagLen = (size_t)block->slotDeadStoreCandidates;
      goto LAB_003eaf08;
    }
  }
  bvToDumps[4].tagLen = 0;
LAB_003eaf08:
  bvToDumps[5].bv = (BVSparse<Memory::JitArenaAllocator> *)anon_var_dwarf_86960f;
  if ((BVSparse<Memory::JitArenaAllocator> *)bvToDumps[4].tagLen ==
      (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    bvToDumps[5].tag = (char16 *)0x0;
  }
  else {
    auStack_d8[1] = 0x3eaf28;
    bvToDumps[5].tag = (char16 *)PAL_wcslen(L"Slot deadStore candidates");
  }
  bvToDumps[5].tagLen = (size_t)this;
  lVar3 = 0x10;
  uVar4 = 0;
  do {
    uVar1 = *(ulong *)((long)bvToDumps + lVar3 + -8);
    if (uVar4 < uVar1) {
      uVar4 = uVar1;
    }
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0xa0);
  lVar3 = 0x10;
  do {
    this_00 = *(BVSparse<Memory::JitArenaAllocator> **)((long)auStack_d8 + lVar3);
    if (this_00 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      auStack_d8[1] = 0x3eaf90;
      Output::Print(((int)uVar4 + 8) - *(int *)((long)bvToDumps + lVar3 + -8),L"%s: ",
                    *(undefined8 *)((long)auStack_d8 + lVar3 + 8));
      auStack_d8[1] = 0x3eaf98;
      BVSparse<Memory::JitArenaAllocator>::Dump(this_00);
    }
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0xa0);
  if (obj != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    Memory::
    DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
              (*(AllocatorType **)(bvToDumps[5].tagLen + 0x10),obj);
    return;
  }
  return;
}

Assistant:

void
BackwardPass::DumpBlockData(BasicBlock * block, IR::Instr* instr)
{
    const int skip = 8;
    BVSparse<JitArenaAllocator>* byteCodeRegisterUpwardExposed = nullptr;
    if (instr)
    {
        // Instr specific bv to dump
        byteCodeRegisterUpwardExposed = GetByteCodeRegisterUpwardExposed(block, instr->m_func, this->tempAlloc);
    }
    BvToDump bvToDumps[] = {
        { block->upwardExposedUses, _u("Exposed Use") },
        { block->typesNeedingKnownObjectLayout, _u("Needs Known Object Layout") },
        { block->upwardExposedFields, _u("Exposed Fields") },
        { block->byteCodeUpwardExposedUsed, _u("Byte Code Use") },
        { byteCodeRegisterUpwardExposed, _u("Byte Code Reg Use") },
        { !this->IsCollectionPass() && !block->isDead && this->DoDeadStoreSlots() ? block->slotDeadStoreCandidates : nullptr, _u("Slot deadStore candidates") },
    };

    size_t maxTagLen = 0;
    for (int i = 0; i < sizeof(bvToDumps) / sizeof(BvToDump); ++i)
    {
        if (bvToDumps[i].tagLen > maxTagLen)
        {
            maxTagLen = bvToDumps[i].tagLen;
        }
    }

    for (int i = 0; i < sizeof(bvToDumps) / sizeof(BvToDump); ++i)
    {
        if (bvToDumps[i].bv)
        {
            Output::Print((int)(maxTagLen + skip - bvToDumps[i].tagLen), _u("%s: "), bvToDumps[i].tag);
            bvToDumps[i].bv->Dump();
        }
    }
    if (byteCodeRegisterUpwardExposed)
    {
        JitAdelete(this->tempAlloc, byteCodeRegisterUpwardExposed);
    }
}